

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.cc
# Opt level: O2

longlong __thiscall BitStream::getBitsSigned(BitStream *this,size_t nbits)

{
  unsigned_long_long uVar1;
  long lVar2;
  
  uVar1 = read_bits(&this->p,&this->bit_offset,&this->bits_available,nbits);
  lVar2 = 0;
  if (1L << ((byte)nbits - 1 & 0x3f) < (long)uVar1) {
    lVar2 = -1L << ((byte)nbits & 0x3f);
  }
  return uVar1 + lVar2;
}

Assistant:

long long
BitStream::getBitsSigned(size_t nbits)
{
    unsigned long long bits = read_bits(this->p, this->bit_offset, this->bits_available, nbits);
    long long result = 0;
    if (static_cast<long long>(bits) > 1LL << (nbits - 1)) {
        result = static_cast<long long>(bits - (1ULL << nbits));
    } else {
        result = static_cast<long long>(bits);
    }
    return result;
}